

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_manager_stateless_kernel_1.h
# Opt level: O2

void __thiscall
dlib::
memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
::deallocate(memory_manager_stateless_kernel_1<dlib::queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node>
             *this,node *item)

{
  if (item != (node *)0x0) {
    queue_kernel_2<dlib::directory,_20UL,_dlib::memory_manager_stateless_kernel_1<char>_>::node::
    ~node(item);
  }
  operator_delete(item);
  return;
}

Assistant:

void deallocate (
                T* item
            )
            {
                delete item;
            }